

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O3

size_t wasm::FunctionHasher::hashFunction(Function *func)

{
  size_t sVar1;
  ExprHasher local_30;
  
  local_30.super__Function_base._M_functor._8_8_ = 0;
  local_30.super__Function_base._M_functor._M_unused._M_function_pointer =
       ExpressionAnalyzer::nothingHasher;
  local_30._M_invoker =
       std::
       _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
       ::_M_invoke;
  local_30.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
       ::_M_manager;
  sVar1 = flexibleHashFunction(func,&local_30);
  if (local_30.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_30.super__Function_base._M_manager)
              ((_Any_data *)&local_30,(_Any_data *)&local_30,__destroy_functor);
  }
  return sVar1;
}

Assistant:

static size_t hashFunction(Function* func) {
    return flexibleHashFunction(func, ExpressionAnalyzer::nothingHasher);
  }